

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O3

int weapon_hit_bonus(obj *weapon)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  char cVar6;
  undefined *puVar7;
  uint uVar8;
  
  iVar2 = weapon_type(weapon);
  if ((u.twoweap == '\0') || ((uwep != weapon && (uswapwep != weapon)))) {
    uVar8 = 0;
    if (iVar2 == 0) goto LAB_0028691b;
    if (0x1d < iVar2) {
      if (iVar2 == 0x25) {
        cVar6 = '\x01';
        if ('\x01' < u.weapon_skills[0x25].skill) {
          cVar6 = u.weapon_skills[0x25].skill;
        }
        uVar8 = ((uint)(byte)(cVar6 + 1) << (urole.malenum == 0x160 || urole.malenum == 0x165)) >> 1
        ;
        goto LAB_0028691b;
      }
      uVar8 = 0;
      if (iVar2 != 0x26) goto LAB_0028691b;
      goto LAB_00286888;
    }
    uVar8 = (uint)u.weapon_skills[iVar2].skill;
    if (4 < uVar8) {
      impossible("weapon_hit_bonus: bad skill %d");
      uVar8 = 0xfffffffc;
      goto LAB_0028691b;
    }
    uVar4 = (ulong)uVar8 & 0xff;
    puVar7 = &DAT_002d9cd4;
  }
  else {
LAB_00286888:
    bVar5 = u.weapon_skills[iVar2].skill;
    bVar1 = u.weapon_skills[0x26].skill;
    if ((char)bVar5 < u.weapon_skills[0x26].skill) {
      bVar1 = bVar5;
    }
    if (4 < bVar1) {
      impossible("weapon_hit_bonus: bad skill %d",(ulong)(uint)(int)(char)bVar1);
      uVar8 = 0xfffffff7;
      goto LAB_0028691b;
    }
    uVar4 = (ulong)bVar1;
    puVar7 = &DAT_002d9ce8;
  }
  uVar8 = *(uint *)(puVar7 + uVar4 * 4);
LAB_0028691b:
  uVar3 = uVar8;
  if (u.usteed != (monst *)0x0) {
    if ((byte)u.weapon_skills[0x27].skill < 2) {
      uVar8 = uVar8 - 2;
    }
    else if (u.weapon_skills[0x27].skill == '\x02') {
      uVar8 = uVar8 - 1;
    }
    else if (u.weapon_skills[0x27].skill == '\x04') {
      uVar8 = uVar8 + 2;
    }
    uVar3 = uVar8 - 2;
    if (u.twoweap == '\0') {
      uVar3 = uVar8;
    }
  }
  return uVar3;
}

Assistant:

int weapon_hit_bonus(struct obj *weapon)
{
    int type, wep_type, skill, bonus = 0;
    static const char bad_skill[] = "weapon_hit_bonus: bad skill %d";

    wep_type = weapon_type(weapon);
    /* use two weapon skill only if attacking with one of the wielded weapons */
    type = (u.twoweap && (weapon == uwep || weapon == uswapwep)) ?
	    P_TWO_WEAPON_COMBAT : wep_type;
    if (type == P_NONE) {
	bonus = 0;
    } else if (type <= P_LAST_WEAPON) {
	switch (P_SKILL(type)) {
	    default: impossible(bad_skill, P_SKILL(type)); /* fall through */
	    case P_ISRESTRICTED:
	    case P_UNSKILLED:   bonus = -4; break;
	    case P_BASIC:       bonus =  0; break;
	    case P_SKILLED:     bonus =  2; break;
	    case P_EXPERT:      bonus =  5; break;
	}
    } else if (type == P_TWO_WEAPON_COMBAT) {
	skill = P_SKILL(P_TWO_WEAPON_COMBAT);
	if (P_SKILL(wep_type) < skill) skill = P_SKILL(wep_type);
	switch (skill) {
	    default: impossible(bad_skill, skill); /* fall through */
	    case P_ISRESTRICTED:
	    case P_UNSKILLED:   bonus = -9; break;
	    case P_BASIC:	bonus = -7; break;
	    case P_SKILLED:	bonus = -5; break;
	    case P_EXPERT:	bonus = -2; break;
	}
    } else if (type == P_BARE_HANDED_COMBAT) {
	/*
	 *	       b.h.  m.a.
	 *	unskl:	+1   n/a
	 *	basic:	+1    +3
	 *	skild:	+2    +4
	 *	exprt:	+2    +5
	 *	mastr:	+3    +6
	 *	grand:	+3    +7
	 */
	bonus = P_SKILL(type);
	bonus = max(bonus,P_UNSKILLED) - 1;	/* unskilled => 0 */
	bonus = ((bonus + 2) * (martial_bonus() ? 2 : 1)) / 2;
    }

	/* KMH -- It's harder to hit while you are riding */
	if (u.usteed) {
		switch (P_SKILL(P_RIDING)) {
		    case P_ISRESTRICTED:
		    case P_UNSKILLED:   bonus -= 2; break;
		    case P_BASIC:       bonus -= 1; break;
		    case P_SKILLED:     break;
		    /* but an expert can use the added momentum */
		    case P_EXPERT:      bonus += 2; break;
		}
		if (u.twoweap) bonus -= 2;
	}

    return bonus;
}